

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Question * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint *id)

{
  uint *puVar1;
  uint uVar2;
  Question *pQVar3;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  puVar1 = (this->freeIds).c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 != (this->freeIds).c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    *id = *puVar1;
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::pop(&this->freeIds);
    return (this->slots).builder.ptr + *id;
  }
  uVar2 = (uint)(((long)(this->slots).builder.pos - (long)(this->slots).builder.ptr) / 0x28);
  *id = uVar2;
  _kjCondition.value = -1 < (int)uVar2;
  if (_kjCondition.value) {
    pQVar3 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::add<>(&this->slots);
    return pQVar3;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,0xfb,FAILED,"!isHigh(id)","_kjCondition,\"2^31 concurrent questions?!!?!\"",
             &_kjCondition,(char (*) [31])"2^31 concurrent questions?!!?!");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

T& next(Id& id) {
    if (freeIds.empty()) {
      id = slots.size();
      KJ_ASSERT(!isHigh(id), "2^31 concurrent questions?!!?!");
      return slots.add();
    } else {
      id = freeIds.top();
      freeIds.pop();
      return slots[id];
    }
  }